

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

void anon_unknown.dwarf_13e445::dumpNode(Node *node,uint indent)

{
  undefined8 in_RAX;
  
  switch(node->TypeID) {
  case 0:
    _GLOBAL__N_1::dumpNode((_GLOBAL__N_1 *)(ulong)indent);
    break;
  case 1:
    _GLOBAL__N_1::dumpNode();
    break;
  default:
    fprintf(_stderr,"%*s<node: %p, unknown>\n",(ulong)(indent * 2),"",node,in_RAX);
    return;
  case 3:
    __assert_fail("0 && \"unexpected keyvalue node\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildFile.cpp"
                  ,0x46,"void (anonymous namespace)::dumpNode(llvm::yaml::Node *, unsigned int)");
  case 4:
    _GLOBAL__N_1::dumpNode();
    break;
  case 5:
    _GLOBAL__N_1::dumpNode();
    break;
  case 6:
    _GLOBAL__N_1::dumpNode((_GLOBAL__N_1 *)(ulong)indent);
  }
  return;
}

Assistant:

static void dumpNode(llvm::yaml::Node* node, unsigned indent) {
  switch (node->getType()) {
  default: {
    fprintf(stderr, "%*s<node: %p, unknown>\n", indent*2, "", node);
    break;
  }

  case llvm::yaml::Node::NK_Null: {
    fprintf(stderr, "%*s(null)\n", indent*2, "");
    break;
  }

  case llvm::yaml::Node::NK_Scalar: {
    llvm::yaml::ScalarNode* scalar = llvm::cast<llvm::yaml::ScalarNode>(node);
    SmallString<256> storage;
    fprintf(stderr, "%*s(scalar: '%s')\n", indent*2, "",
            scalar->getValue(storage).str().c_str());
    break;
  }

  case llvm::yaml::Node::NK_KeyValue: {
    assert(0 && "unexpected keyvalue node");
    break;
  }

  case llvm::yaml::Node::NK_Mapping: {
    llvm::yaml::MappingNode* map = llvm::cast<llvm::yaml::MappingNode>(node);
    fprintf(stderr, "%*smap:\n", indent*2, "");
    for (auto& it: *map) {
      fprintf(stderr, "%*skey:\n", (indent+1)*2, "");
      dumpNode(it.getKey(), indent+2);
      fprintf(stderr, "%*svalue:\n", (indent+1)*2, "");
      dumpNode(it.getValue(), indent+2);
    }
    break;
  }

  case llvm::yaml::Node::NK_Sequence: {
    llvm::yaml::SequenceNode* sequence =
      llvm::cast<llvm::yaml::SequenceNode>(node);
    fprintf(stderr, "%*ssequence:\n", indent*2, "");
    for (auto& it: *sequence) {
      dumpNode(&it, indent+1);
    }
    break;
  }

  case llvm::yaml::Node::NK_Alias: {
    fprintf(stderr, "%*s(alias)\n", indent*2, "");
    break;
  }
  }
}